

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O3

void __thiscall
midi_container::scan_for_loops
          (midi_container *this,bool p_xmi_loops,bool p_marker_loops,bool p_rpgmaker_loops,
          bool p_touhou_loops)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  pointer puVar5;
  pointer pmVar6;
  pointer pmVar7;
  size_type sVar8;
  long lVar9;
  ulong uVar10;
  size_type sVar11;
  long lVar12;
  char *pcVar13;
  ulong *puVar14;
  long lVar15;
  long lVar16;
  char cVar17;
  ulong uVar18;
  pointer pmVar19;
  ulong uVar20;
  pointer *ppmVar21;
  ulong uVar22;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  pointer local_50;
  size_type local_48;
  ulong local_40;
  size_t local_38;
  
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar11 = 1;
  if (this->m_form == 2) {
    sVar11 = ((long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  }
  this_00 = &this->m_timestamp_loop_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,sVar11);
  this_01 = &this->m_timestamp_loop_end;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,sVar11);
  if (sVar11 != 0) {
    puVar5 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = 0;
    do {
      puVar5[sVar8] = 0xffffffffffffffff;
      puVar2[sVar8] = 0xffffffffffffffff;
      sVar8 = sVar8 + 1;
    } while (sVar11 != sVar8);
  }
  uVar1 = this->m_form;
  if (p_touhou_loops && uVar1 == 0) {
    pmVar6 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pmVar6;
    if (lVar9 != 0) {
      lVar12 = 0;
      do {
        lVar16 = *(long *)&pmVar6[lVar12].m_events.
                           super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        lVar15 = (long)*(pointer *)
                        ((long)&pmVar6[lVar12].m_events.
                                super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                        + 8) - lVar16;
        if (lVar15 != 0) {
          lVar15 = lVar15 >> 6;
          puVar5 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          puVar2 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar13 = (char *)(lVar16 + 0x19);
          do {
            if (*(int *)(pcVar13 + -0x11) == 3) {
              cVar17 = pcVar13[-1];
              if (cVar17 == '\x02') {
                if (*pcVar13 == '\0') {
                  *puVar5 = *(unsigned_long *)(pcVar13 + -0x19);
                  cVar17 = pcVar13[-1];
                  goto LAB_001079bc;
                }
LAB_001079e1:
                *(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start = 0xffffffffffffffff;
                *(this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start = 0xffffffffffffffff;
                goto LAB_001079fd;
              }
LAB_001079bc:
              if (cVar17 == '\x04') {
                if (*pcVar13 != '\0') goto LAB_001079e1;
                *puVar2 = *(unsigned_long *)(pcVar13 + -0x19);
              }
            }
            pcVar13 = pcVar13 + 0x40;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != (lVar9 >> 3) * -0x5555555555555555);
    }
  }
LAB_001079fd:
  if (p_rpgmaker_loops) {
    pmVar6 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pmVar6;
    if (lVar9 != 0) {
      lVar9 = (lVar9 >> 3) * -0x5555555555555555;
      lVar12 = 0;
      do {
        lVar16 = 0;
        if (uVar1 == 2) {
          lVar16 = lVar12;
        }
        puVar14 = *(ulong **)
                   &pmVar6[lVar12].m_events.
                    super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        lVar15 = (long)*(pointer *)
                        ((long)&pmVar6[lVar12].m_events.
                                super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                        + 8) - (long)puVar14;
        if (lVar15 != 0) {
          lVar15 = lVar15 >> 6;
          puVar5 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar15 = lVar15 + (ulong)(lVar15 == 0);
          do {
            if (((int)puVar14[1] == 3) && (((byte)puVar14[3] & 0xfe) == 0x6e)) {
              if ((byte)puVar14[3] == 0x6e) {
                (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start[lVar16] = 0xffffffffffffffff;
                (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start[lVar16] = 0xffffffffffffffff;
                goto LAB_00107ac7;
              }
              uVar18 = puVar5[lVar16];
              if ((uVar18 == 0xffffffffffffffff) || (*puVar14 < uVar18)) {
                puVar5[lVar16] = *puVar14;
              }
            }
            puVar14 = puVar14 + 8;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar9 + (ulong)(lVar9 == 0));
    }
  }
LAB_00107ac7:
  if (p_xmi_loops) {
    pmVar6 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pmVar6;
    if (lVar9 != 0) {
      lVar9 = (lVar9 >> 3) * -0x5555555555555555;
      lVar12 = 0;
      do {
        puVar14 = *(ulong **)
                   &pmVar6[lVar12].m_events.
                    super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        lVar16 = (long)*(pointer *)
                        ((long)&pmVar6[lVar12].m_events.
                                super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                        + 8) - (long)puVar14;
        if (lVar16 != 0) {
          lVar16 = lVar16 >> 6;
          lVar15 = 0;
          if (uVar1 == 2) {
            lVar15 = lVar12;
          }
          puVar5 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          puVar2 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar16 = lVar16 + (ulong)(lVar16 == 0);
          do {
            if (((int)puVar14[1] == 3) && (((byte)puVar14[3] & 0xfc) == 0x74)) {
              if ((byte)((byte)puVar14[3] | 2) == 0x76) {
                uVar18 = puVar5[lVar15];
                if ((uVar18 == 0xffffffffffffffff) || (*puVar14 < uVar18)) {
                  puVar5[lVar15] = *puVar14;
                }
              }
              else {
                uVar18 = puVar2[lVar15];
                if ((uVar18 == 0xffffffffffffffff) || (uVar18 < *puVar14)) {
                  puVar2[lVar15] = *puVar14;
                }
              }
            }
            puVar14 = puVar14 + 8;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar9 + (ulong)(lVar9 == 0));
    }
  }
  local_48 = sVar11;
  if (p_marker_loops) {
    pmVar6 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pmVar7 != pmVar6) {
      uVar18 = 0;
      do {
        uVar10 = 0;
        if (this->m_form == 2) {
          uVar10 = uVar18;
        }
        pmVar19 = pmVar6[uVar18].m_events.
                  super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pmVar6[uVar18].m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
            _M_impl.super__Vector_impl_data._M_finish != pmVar19) {
          pmVar6 = pmVar6 + uVar18;
          lVar9 = 0x30;
          uVar20 = 0;
          local_50 = pmVar6;
          local_40 = uVar18;
          do {
            if ((((*(int *)(pmVar19->m_data + lVar9 + -0x40) == 7) &&
                 (uVar18 = (*(long *)(pmVar19->m_data + lVar9 + -0x38) +
                           *(long *)(pmVar19->m_data + lVar9 + -0x18)) -
                           *(long *)(pmVar19->m_data + lVar9 + -0x20), 8 < uVar18)) &&
                (pmVar19->m_data[lVar9 + -0x30] == 0xff)) &&
               (pmVar19->m_data[lVar9 + -0x2f] == '\x06')) {
              sVar11 = uVar18 - 2;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_68,sVar11);
              puVar3 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar22 = ((*(long *)(pmVar19->m_data + lVar9 + -0x38) +
                        *(long *)(pmVar19->m_data + lVar9 + -0x18)) -
                       *(long *)(pmVar19->m_data + lVar9 + -0x20)) - 2;
              if (sVar11 <= uVar22) {
                uVar22 = sVar11;
              }
              local_38 = uVar22;
              if (0xd < uVar22) {
                local_38 = 0xe;
              }
              memcpy(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,pmVar19->m_data + lVar9 + -0x2e,
                     local_38);
              if (0xe < uVar22) {
                memcpy(puVar3 + local_38,*(void **)(pmVar19->m_data + lVar9 + -0x20),
                       uVar22 - local_38);
              }
              pmVar6 = local_50;
              if (uVar18 == 9) {
                iVar4 = strncasecmp((char *)local_68.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,"loopEnd",7);
                pmVar6 = local_50;
                if (iVar4 == 0) {
                  puVar5 = (this_01->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar18 = *(ulong *)(pmVar19->m_data + lVar9 + -0x48);
                  if ((puVar5[uVar10] == 0xffffffffffffffff) || (puVar5[uVar10] < uVar18))
                  goto LAB_00107d44;
                }
              }
              else if ((uVar18 == 0xb) &&
                      (iVar4 = strncasecmp((char *)local_68.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                           "loopStart",9), iVar4 == 0)) {
                puVar5 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                uVar18 = *(ulong *)(pmVar19->m_data + lVar9 + -0x48);
                if ((puVar5[uVar10] == 0xffffffffffffffff) || (uVar18 < puVar5[uVar10])) {
LAB_00107d44:
                  puVar5[uVar10] = uVar18;
                }
              }
            }
            uVar20 = uVar20 + 1;
            pmVar19 = (pmVar6->m_events).super__Vector_base<midi_event,_std::allocator<midi_event>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar9 = lVar9 + 0x40;
          } while (uVar20 < (ulong)((long)(pmVar6->m_events).
                                          super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar19
                                   >> 6));
          pmVar6 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar18 = local_40;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)(((long)pmVar7 - (long)pmVar6 >> 3) * -0x5555555555555555));
    }
  }
  if (local_48 != 0) {
    uVar1 = this->m_form;
    pmVar6 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = ((long)pmVar6 - (long)pmVar7 >> 3) * -0x5555555555555555;
    puVar5 = (this->m_timestamp_loop_start).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_timestamp_loop_end).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = 0;
    do {
      if (uVar1 == 2) {
        uVar18 = pmVar7[sVar11].m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].m_timestamp;
      }
      else if (pmVar6 == pmVar7) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        ppmVar21 = &(pmVar7->m_events).super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        lVar12 = lVar9 + (ulong)(lVar9 == 0);
        do {
          if (uVar18 < (*ppmVar21)[-1].m_timestamp) {
            uVar18 = (*ppmVar21)[-1].m_timestamp;
          }
          ppmVar21 = ppmVar21 + 3;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      uVar10 = puVar5[sVar11];
      if ((uVar10 != 0xffffffffffffffff) && ((uVar10 == puVar2[sVar11] || (uVar10 == uVar18)))) {
        puVar5[sVar11] = 0xffffffffffffffff;
        puVar2[sVar11] = 0xffffffffffffffff;
      }
      sVar11 = sVar11 + 1;
    } while (sVar11 != local_48);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void midi_container::scan_for_loops( bool p_xmi_loops, bool p_marker_loops, bool p_rpgmaker_loops, bool p_touhou_loops )
{
    std::vector<uint8_t> data;

    unsigned long subsong_count = m_form == 2 ? m_tracks.size() : 1;

    m_timestamp_loop_start.resize( subsong_count );
    m_timestamp_loop_end.resize( subsong_count );

    for ( unsigned long i = 0; i < subsong_count; ++i )
    {
        m_timestamp_loop_start[ i ] = ~0UL;
        m_timestamp_loop_end[ i ] = ~0UL;
    }

    if ( p_touhou_loops && m_form == 0 )
    {
        bool loop_start_found = false;
        bool loop_end_found = false;
        bool errored = false;

        for ( unsigned long i = 0; !errored && i < m_tracks.size(); ++i )
        {
            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; !errored && j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change )
                {
                    if ( event.m_data[ 0 ] == 2 )
                    {
                        if ( event.m_data[ 1 ] != 0 )
                        {
                            errored = true;
                            break;
                        }
                        m_timestamp_loop_start[ 0 ] = event.m_timestamp;
                        loop_start_found = true;
                    }
                    if ( event.m_data[ 0 ] == 4 )
                    {
                        if ( event.m_data[ 1 ] != 0 )
                        {
                            errored = true;
                            break;
                        }
                        m_timestamp_loop_end[ 0 ] = event.m_timestamp;
                        loop_end_found = true;
                    }
                }
            }
        }

        if ( errored )
        {
            m_timestamp_loop_start[ 0 ] = ~0UL;
            m_timestamp_loop_end[ 0 ] = ~0UL;
        }
    }

    if ( p_rpgmaker_loops )
    {
        bool emidi_commands_found = false;

        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                    ( event.m_data[ 0 ] == 110 || event.m_data[ 0 ] == 111 ) )
                {
                    if ( event.m_data[ 0 ] == 110 )
                    {
                        emidi_commands_found = true;
                        break;
                    }
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }

            if ( emidi_commands_found )
            {
                m_timestamp_loop_start[ subsong ] = ~0UL;
                m_timestamp_loop_end[ subsong ] = ~0UL;
                break;
            }
        }
    }

    if ( p_xmi_loops )
    {
        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                    ( event.m_data[ 0 ] >= 0x74 && event.m_data[ 0 ] <= 0x77 ) )
                {
                    if ( event.m_data[ 0 ] == 0x74 || event.m_data[ 0 ] == 0x76 )
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                    else
                    {
                        if ( m_timestamp_loop_end[ subsong ] == ~0UL || m_timestamp_loop_end[ subsong ] < event.m_timestamp )
                        {
                            m_timestamp_loop_end[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }
        }
    }

    if ( p_marker_loops )
    {
        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::extended &&
                    event.get_data_count() >= 9 &&
                    event.m_data[ 0 ] == 0xFF && event.m_data[ 1 ] == 0x06 )
                {
                    unsigned long data_count = event.get_data_count() - 2;
                    data.resize( data_count );
                    event.copy_data( &data[0], 2, data_count );

                    if ( data_count == 9 && !strncasecmp( (const char *) &data[0], "loopStart", 9 ) )
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                    else if ( data_count == 7 && !strncasecmp( (const char *) &data[0], "loopEnd", 7 ) )
                    {
                        if ( m_timestamp_loop_end[ subsong ] == ~0UL || m_timestamp_loop_end[ subsong ] < event.m_timestamp )
                        {
                            m_timestamp_loop_end[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }
        }
    }

    // Sanity

    for ( unsigned long i = 0; i < subsong_count; ++i )
    {
        unsigned long timestamp_song_end;
        if ( m_form == 2 )
            timestamp_song_end = m_tracks[i][m_tracks[i].get_count()-1].m_timestamp;
        else
        {
            timestamp_song_end = 0;
            for (unsigned long j = 0; j < m_tracks.size(); ++j)
            {
                const midi_track & track = m_tracks[j];
                unsigned long timestamp = track[track.get_count()-1].m_timestamp;
                if (timestamp > timestamp_song_end)
                    timestamp_song_end = timestamp;
            }
        }
        if ( m_timestamp_loop_start[ i ] != ~0UL && ( ( m_timestamp_loop_start[ i ] == m_timestamp_loop_end[ i ] ) || ( m_timestamp_loop_start[ i ] == timestamp_song_end ) ) )
        {
            m_timestamp_loop_start[ i ] = ~0UL;
            m_timestamp_loop_end[ i ] = ~0UL;
        }
    }
}